

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.h
# Opt level: O0

int32_t icu_63::UCharsTrie::readNodeValue(char16_t *pos,int32_t leadUnit)

{
  uint local_18;
  int32_t value;
  int32_t leadUnit_local;
  char16_t *pos_local;
  
  if (leadUnit < 0x4040) {
    local_18 = (leadUnit >> 6) - 1;
  }
  else if (leadUnit < 0x7fc0) {
    local_18 = ((leadUnit & 0x7fc0U) - 0x4040) * 0x400 | (uint)(ushort)*pos;
  }
  else {
    local_18 = CONCAT22(*pos,pos[1]);
  }
  return local_18;
}

Assistant:

static inline int32_t readNodeValue(const char16_t *pos, int32_t leadUnit) {
        // U_ASSERT(kMinValueLead<=leadUnit && leadUnit<kValueIsFinal);
        int32_t value;
        if(leadUnit<kMinTwoUnitNodeValueLead) {
            value=(leadUnit>>6)-1;
        } else if(leadUnit<kThreeUnitNodeValueLead) {
            value=(((leadUnit&0x7fc0)-kMinTwoUnitNodeValueLead)<<10)|*pos;
        } else {
            value=(pos[0]<<16)|pos[1];
        }
        return value;
    }